

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_is_inter(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,aom_writer *w,int is_inter)

{
  int iVar1;
  aom_writer *in_RCX;
  uint8_t in_DL;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  int in_stack_ffffffffffffffcc;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI[1].plane[1].seg_iqmatrix[7] + 10),in_DL,'\x05');
  if ((iVar1 == 0) &&
     (iVar1 = segfeature_active((segmentation *)(in_RDI[1].plane[1].seg_iqmatrix[7] + 10),in_DL,'\a'
                               ), iVar1 == 0)) {
    av1_get_intra_inter_context(in_RDI);
    aom_write_symbol(in_RCX,in_R8D,*(aom_cdf_prob **)(in_RSI + 0x2998),in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

static inline void write_is_inter(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                  uint8_t segment_id, aom_writer *w,
                                  const int is_inter) {
  if (!segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME)) {
    if (segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
      assert(is_inter);
      return;
    }
    const int ctx = av1_get_intra_inter_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    aom_write_symbol(w, is_inter, ec_ctx->intra_inter_cdf[ctx], 2);
  }
}